

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.h
# Opt level: O0

int aom_read_symbol_(aom_reader *r,aom_cdf_prob *cdf,int nsymbs)

{
  int iVar1;
  int in_EDX;
  aom_reader *in_RSI;
  long in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = aom_read_cdf_(in_RSI,(aom_cdf_prob *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  if (*(char *)(in_RDI + 0x38) != '\0') {
    update_cdf((aom_cdf_prob *)in_RSI,(int8_t)iVar1,in_EDX);
  }
  return iVar1;
}

Assistant:

static inline int aom_read_symbol_(aom_reader *r, aom_cdf_prob *cdf,
                                   int nsymbs ACCT_STR_PARAM) {
  int ret;
  ret = aom_read_cdf(r, cdf, nsymbs, ACCT_STR_NAME);
  if (r->allow_update_cdf) update_cdf(cdf, ret, nsymbs);
  return ret;
}